

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

bool __thiscall pybind11::function::is_cpp_function(function *this)

{
  bool bVar1;
  int iVar2;
  PyObject **ppPVar3;
  bool local_21;
  handle local_20;
  handle local_18;
  handle fun;
  function *this_local;
  
  fun.m_ptr = (PyObject *)this;
  handle::handle(&local_20,(this->super_object).super_handle.m_ptr);
  local_18 = detail::get_function(local_20);
  bVar1 = handle::operator_cast_to_bool(&local_18);
  local_21 = false;
  if (bVar1) {
    ppPVar3 = handle::ptr(&local_18);
    iVar2 = _PyObject_TypeCheck(*ppPVar3,(PyTypeObject *)&PyCFunction_Type);
    local_21 = iVar2 != 0;
  }
  return local_21;
}

Assistant:

bool is_cpp_function() const {
        handle fun = detail::get_function(m_ptr);
        return fun && PyCFunction_Check(fun.ptr());
    }